

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

int fiobj_data_save(FIOBJ o,char *filename)

{
  int iVar1;
  int __fd;
  int *piVar2;
  ssize_t sVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  int target;
  long lVar6;
  char buf [1024];
  
  iVar1 = *(int *)(o + 0x30);
  __fd = open(filename,0x242,0x1ff);
  if (iVar1 == -2) {
    if (__fd == -1) {
      return -1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar6 = 0;
    do {
      fiobj_data_pread((fio_str_info_s *)buf,*(FIOBJ *)(o + 0x10),*(long *)(o + 0x18) + lVar6,0x1000
                      );
      if (buf._8_8_ == 0) break;
      uVar4 = *(ulong *)(o + 0x20) - lVar6;
      if ((ulong)(buf._8_8_ + lVar6) <= *(ulong *)(o + 0x20)) {
        uVar4 = buf._8_8_;
      }
      if (uVar4 == 0) break;
      uVar5 = write(__fd,(void *)buf._16_8_,uVar4);
      if (((long)uVar5 < 0) || (uVar5 < uVar4)) {
        close(__fd);
        goto LAB_00139e88;
      }
      lVar6 = lVar6 + uVar5;
    } while (uVar4 == 0x1000);
  }
  else {
    if (iVar1 != -1) {
      if (__fd != -1) {
        piVar2 = __errno_location();
        *piVar2 = 0;
        lVar6 = 0;
        do {
          __n = pread(*(int *)(o + 0x30),buf,0x400,lVar6);
          if (__n == 0) goto LAB_00139e04;
          if ((long)__n < 0) break;
          sVar3 = write(__fd,buf,__n);
          lVar6 = lVar6 + sVar3;
        } while ((long)__n <= sVar3);
        close(__fd);
        unlink(filename);
      }
      return -1;
    }
    if (__fd == -1) {
      return -1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar4 = *(ulong *)(o + 0x20);
    uVar5 = 0;
    do {
      sVar3 = write(__fd,(void *)(*(long *)(o + 8) + uVar5),uVar4 - uVar5);
      if (sVar3 < 0) {
        close(__fd);
LAB_00139e88:
        unlink(filename);
        return -1;
      }
      uVar5 = uVar5 + sVar3;
      uVar4 = *(ulong *)(o + 0x20);
    } while (uVar5 < uVar4);
  }
LAB_00139e04:
  close(__fd);
  return 0;
}

Assistant:

int fiobj_data_save(FIOBJ o, const char *filename) {
  switch (obj2io(o)->fd) {
  case -1:
    return fiobj_data_save_str(o, filename);
    break;
  case -2:
    return fiobj_data_save_slice(o, filename);
    break;
  default:
    return fiobj_data_save_file(o, filename);
  }
}